

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O0

void glmc_euler_angles(vec4 *m,float *dest)

{
  float __x;
  float fVar1;
  float __x_00;
  float fVar2;
  float __x_01;
  float *in_RSI;
  float *in_RDI;
  float thetaZ;
  float thetaY;
  float thetaX;
  float m22;
  float m21;
  float m20;
  float m11;
  float m10;
  float m01;
  float m00;
  float local_38;
  float local_34;
  float local_30;
  
  __x = *in_RDI;
  fVar1 = in_RDI[4];
  __x_00 = in_RDI[8];
  fVar2 = in_RDI[9];
  __x_01 = in_RDI[10];
  if (1.0 <= __x_00) {
    local_34 = 1.5707964;
    local_30 = atan2f(in_RDI[1],in_RDI[5]);
    local_38 = 0.0;
  }
  else if (__x_00 <= -1.0) {
    local_34 = -1.5707964;
    local_30 = atan2f(in_RDI[1],in_RDI[5]);
    local_30 = -local_30;
    local_38 = 0.0;
  }
  else {
    local_34 = asinf(__x_00);
    local_30 = atan2f(-fVar2,__x_01);
    local_38 = atan2f(-fVar1,__x);
  }
  *in_RSI = local_30;
  in_RSI[1] = local_34;
  in_RSI[2] = local_38;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_angles(mat4 m, vec3 dest) {
  glm_euler_angles(m, dest);
}